

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setVertexData(Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,
             int index)

{
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar1;
  string asStack_38 [32];
  
  if ((-1 < index) && (index < this->vertexCount)) {
    pGVar1 = this->vertexList;
    std::__cxx11::string::string(asStack_38,(string *)data);
    std::__cxx11::string::_M_assign((string *)&pGVar1[(uint)index].data);
    std::__cxx11::string::~string(asStack_38);
  }
  return;
}

Assistant:

void Graph<T>::setVertexData(T data, int index)
{
  //sets the data for the vertex at the passed index
  //we only set the data if the index passed is valid
  if(index >= 0 && index < vertexCount)
  {
    vertexList[index].setData(data);
  }

}